

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint n;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pObj_00;
  int local_114;
  int local_110;
  int CountMax;
  int CountCur;
  int k;
  int i;
  int nDigits;
  Abc_Obj_t *pObj;
  char PrefLo [100];
  char local_88 [8];
  char PrefLi [100];
  char *pName;
  Abc_Ntk_t *pNtk_local;
  
  local_114 = 0;
  for (CountCur = 0; iVar1 = Abc_NtkPiNum(pNtk), CountCur < iVar1; CountCur = CountCur + 1) {
    pAVar3 = Abc_NtkPi(pNtk,CountCur);
    local_110 = 0;
    pcVar4 = Abc_ObjName(pAVar3);
    for (CountMax = 0; (pcVar4[CountMax] != '\0' && (pcVar4[CountMax] == 'l'));
        CountMax = CountMax + 1) {
      local_110 = local_110 + 1;
    }
    local_114 = Abc_MaxInt(local_114,local_110);
  }
  for (CountCur = 0; iVar1 = Abc_NtkPoNum(pNtk), CountCur < iVar1; CountCur = CountCur + 1) {
    pAVar3 = Abc_NtkPo(pNtk,CountCur);
    local_110 = 0;
    pcVar4 = Abc_ObjName(pAVar3);
    for (CountMax = 0; (pcVar4[CountMax] != '\0' && (pcVar4[CountMax] == 'l'));
        CountMax = CountMax + 1) {
      local_110 = local_110 + 1;
    }
    local_114 = Abc_MaxInt(local_114,local_110);
  }
  if (local_114 < 0x62) {
    for (CountCur = 0; CountCur <= local_114; CountCur = CountCur + 1) {
      PrefLo[(long)CountCur + -8] = 'l';
      local_88[CountCur] = 'l';
    }
    local_88[CountCur] = 'i';
    PrefLo[(long)CountCur + -8] = 'o';
    local_88[CountCur + 1] = '\0';
    PrefLo[(long)(CountCur + 1) + -8] = '\0';
    iVar1 = Abc_NtkIsNetlist(pNtk);
    if (iVar1 == 0) {
      n = Abc_NtkLatchNum(pNtk);
      iVar1 = Abc_Base10Log(n);
      for (CountCur = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), CountCur < iVar2;
          CountCur = CountCur + 1) {
        pAVar3 = Abc_NtkBox(pNtk,CountCur);
        iVar2 = Abc_ObjIsLatch(pAVar3);
        if (iVar2 != 0) {
          pcVar4 = Abc_ObjNameDummy("l",CountCur,iVar1);
          Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          pObj_00 = Abc_ObjFanin0(pAVar3);
          pcVar4 = Abc_ObjNameDummy(local_88,CountCur,iVar1);
          Abc_ObjAssignName(pObj_00,pcVar4,(char *)0x0);
          pAVar3 = Abc_ObjFanout0(pAVar3);
          pcVar4 = Abc_ObjNameDummy((char *)&pObj,CountCur,iVar1);
          Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
        }
      }
      return;
    }
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x237,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  __assert_fail("CountMax < 100-2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                ,0x22f,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkAddDummyBoxNames( Abc_Ntk_t * pNtk )
{
    char * pName, PrefLi[100], PrefLo[100];
    Abc_Obj_t * pObj;
    int nDigits, i, k, CountCur, CountMax = 0;
    // if PIs/POs already have nodes with what looks like latch names
    // we need to add different prefix for the new latches
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
//printf( "CountMax = %d\n", CountMax );
    assert( CountMax < 100-2 );
    for ( i = 0; i <= CountMax; i++ )
        PrefLi[i] = PrefLo[i] = 'l';
    PrefLi[i] = 'i';
    PrefLo[i] = 'o';
    PrefLi[i+1] = 0;
    PrefLo[i+1] = 0;
    // create latch names
    assert( !Abc_NtkIsNetlist(pNtk) );
    nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("l", i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjNameDummy(PrefLi, i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjNameDummy(PrefLo, i, nDigits), NULL );
    }
/*
    nDigits = Abc_Base10Log( Abc_NtkBlackboxNum(pNtk) );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
    {
        pName = Abc_ObjAssignName( pObj, Abc_ObjNameDummy("B", i, nDigits), NULL );
        nDigitsF = Abc_Base10Log( Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("i", k, nDigitsF) );
        nDigitsF = Abc_Base10Log( Abc_ObjFanoutNum(pObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("o", k, nDigitsF) );
    }
*/
}